

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O1

Config * __thiscall QPDFJob::Config::decodeLevel(Config *this,string *parameter)

{
  int iVar1;
  string local_38;
  
  ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  decode_level_set = true;
  iVar1 = std::__cxx11::string::compare((char *)parameter);
  if (iVar1 == 0) {
    ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    decode_level = qpdf_dl_none;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)parameter);
    if (iVar1 == 0) {
      ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      decode_level = qpdf_dl_generalized;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)parameter);
      if (iVar1 == 0) {
        ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        decode_level = qpdf_dl_specialized;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)parameter);
        if (iVar1 == 0) {
          ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          decode_level = qpdf_dl_all;
        }
        else {
          local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"invalid option","");
          usage(&local_38);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_38._M_dataplus._M_p != &local_38.field_2) {
            operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
          }
        }
      }
    }
  }
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::decodeLevel(std::string const& parameter)
{
    o.m->decode_level_set = true;
    if (parameter == "none") {
        o.m->decode_level = qpdf_dl_none;
    } else if (parameter == "generalized") {
        o.m->decode_level = qpdf_dl_generalized;
    } else if (parameter == "specialized") {
        o.m->decode_level = qpdf_dl_specialized;
    } else if (parameter == "all") {
        o.m->decode_level = qpdf_dl_all;
    } else {
        usage("invalid option");
    }
    return this;
}